

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O1

ma_result ma_device_write__pulse
                    (ma_device *pDevice,void *pPCMFrames,ma_uint32 frameCount,
                    ma_uint32 *pFramesWritten)

{
  void **ppvVar1;
  ma_uint32 *pmVar2;
  void *pvVar3;
  int iVar4;
  uint uVar5;
  ma_uint32 mVar6;
  ulong uVar7;
  ma_log_proc p_Var8;
  char *pcVar9;
  int iVar10;
  uint uVar11;
  ma_context *pmVar12;
  ma_result unaff_R13D;
  uint uVar13;
  size_t bytesToMap;
  ulong local_48;
  ma_uint32 *local_40;
  void *local_38;
  
  local_38 = pPCMFrames;
  if (pPCMFrames == (void *)0x0) {
    __assert_fail("pPCMFrames != __null",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/BombchuLink[P]ORGTerm/miniaudio.h"
                  ,0x4db2,
                  "ma_result ma_device_write__pulse(ma_device *, const void *, ma_uint32, ma_uint32 *)"
                 );
  }
  if (frameCount == 0) {
    __assert_fail("frameCount > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/BombchuLink[P]ORGTerm/miniaudio.h"
                  ,0x4db3,
                  "ma_result ma_device_write__pulse(ma_device *, const void *, ma_uint32, ma_uint32 *)"
                 );
  }
  if (pFramesWritten != (ma_uint32 *)0x0) {
    *pFramesWritten = 0;
  }
  ppvVar1 = &(pDevice->field_23).pulse.pMappedBufferPlayback;
  uVar11 = 0;
  local_40 = pFramesWritten;
  do {
    if (pDevice->state != 2) {
      return -0xca;
    }
    pvVar3 = *ppvVar1;
    if ((pvVar3 != (void *)0x0) &&
       (uVar5 = (pDevice->field_23).pulse.mappedBufferFramesRemainingPlayback, uVar5 != 0)) {
      iVar10 = (&DAT_001157a0)[(pDevice->playback).internalFormat] *
               (pDevice->playback).internalChannels;
      uVar13 = frameCount - uVar11;
      if (uVar5 < frameCount - uVar11) {
        uVar13 = uVar5;
      }
      memcpy((void *)((long)pvVar3 +
                     (ulong)(((pDevice->field_23).pulse.mappedBufferFramesCapacityPlayback - uVar5)
                            * iVar10)),(void *)((ulong)(iVar10 * uVar11) + (long)local_38),
             (ulong)(iVar10 * uVar13));
      pmVar2 = &(pDevice->field_23).pulse.mappedBufferFramesRemainingPlayback;
      *pmVar2 = *pmVar2 - uVar13;
      uVar11 = uVar11 + uVar13;
    }
    mVar6 = (pDevice->field_23).pulse.mappedBufferFramesCapacityPlayback;
    if ((mVar6 != 0) && ((pDevice->field_23).pulse.mappedBufferFramesRemainingPlayback == 0)) {
      iVar10 = (*(pDevice->pContext->field_21).alsa.snd_device_name_hint)
                         ((pDevice->field_23).pulse.pStreamPlayback,
                          (pDevice->field_23).pulse.pMappedBufferPlayback,
                          (ulong)(mVar6 * (pDevice->playback).internalChannels *
                                 (&DAT_001157a0)[(pDevice->playback).internalFormat]),0,0,0);
      if (iVar10 < 0) {
        if (pDevice == (ma_device *)0x0) {
          pmVar12 = (ma_context *)0x0;
        }
        else {
          pmVar12 = pDevice->pContext;
        }
        unaff_R13D = -1;
        if ((pmVar12 != (ma_context *)0x0) && (pmVar12->logCallback != (ma_log_proc)0x0)) {
          (*pmVar12->logCallback)
                    (pmVar12,pDevice,1,"[PulseAudio] Failed to write data to the PulseAudio stream."
                    );
        }
      }
      else {
        (pDevice->field_23).pulse.pMappedBufferPlayback = (void *)0x0;
        (pDevice->field_23).pulse.mappedBufferFramesRemainingPlayback = 0;
        (pDevice->field_23).pulse.mappedBufferFramesCapacityPlayback = 0;
      }
      if (iVar10 < 0) {
        return unaff_R13D;
      }
    }
    if (frameCount <= uVar11 && uVar11 != frameCount) {
      __assert_fail("totalFramesWritten <= frameCount",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/BombchuLink[P]ORGTerm/miniaudio.h"
                    ,0x4dde,
                    "ma_result ma_device_write__pulse(ma_device *, const void *, ma_uint32, ma_uint32 *)"
                   );
    }
    if (uVar11 == frameCount) break;
    do {
      iVar4 = (*(pDevice->pContext->field_21).alsa.snd_pcm_prepare)
                        ((pDevice->field_23).pulse.pStreamPlayback);
      iVar10 = 4;
      if (iVar4 == 0) {
        uVar7 = (*(pDevice->pContext->field_21).alsa.snd_device_name_free_hint)();
        if (uVar7 == 0xffffffffffffffff) {
          if (pDevice == (ma_device *)0x0) {
            pmVar12 = (ma_context *)0x0;
          }
          else {
            pmVar12 = pDevice->pContext;
          }
          unaff_R13D = -1;
          iVar10 = 1;
          if ((pmVar12 != (ma_context *)0x0) &&
             (p_Var8 = pmVar12->logCallback, p_Var8 != (ma_log_proc)0x0)) {
            pcVar9 = "[PulseAudio] Failed to query the stream\'s writable size.";
LAB_0010ee52:
            unaff_R13D = -1;
            iVar10 = 1;
            (*p_Var8)(pmVar12,pDevice,1,pcVar9);
          }
        }
        else if (uVar7 == 0) {
          uVar5 = (*(pDevice->pContext->field_21).alsa.snd_pcm_hw_params_any)
                            ((pDevice->field_23).alsa.pPCMPlayback,1,0);
          iVar10 = ((int)~uVar5 >> 0x1f) * -4 + 1;
          if ((int)uVar5 < 0) {
            unaff_R13D = -1;
          }
        }
        else {
          local_48 = uVar7;
          iVar10 = (*(pDevice->pContext->field_21).alsa.snd_pcm_drain)
                             ((pDevice->field_23).pulse.pStreamPlayback,ppvVar1,&local_48);
          if (iVar10 < 0) {
            if (pDevice == (ma_device *)0x0) {
              pmVar12 = (ma_context *)0x0;
            }
            else {
              pmVar12 = pDevice->pContext;
            }
            unaff_R13D = -1;
            iVar10 = 1;
            if ((pmVar12 != (ma_context *)0x0) &&
               (p_Var8 = pmVar12->logCallback, p_Var8 != (ma_log_proc)0x0)) {
              pcVar9 = "[PulseAudio] Failed to map write buffer.";
              goto LAB_0010ee52;
            }
          }
          else {
            mVar6 = (ma_uint32)
                    (local_48 /
                    ((&DAT_001157a0)[(pDevice->playback).internalFormat] *
                    (pDevice->playback).internalChannels));
            (pDevice->field_23).pulse.mappedBufferFramesCapacityPlayback = mVar6;
            (pDevice->field_23).pulse.mappedBufferFramesRemainingPlayback = mVar6;
            iVar10 = 4;
          }
        }
      }
    } while (iVar10 == 5);
    if (iVar10 != 4) {
      return unaff_R13D;
    }
  } while (uVar11 < frameCount);
  if (local_40 != (ma_uint32 *)0x0) {
    *local_40 = uVar11;
  }
  return 0;
}

Assistant:

static ma_result ma_device_write__pulse(ma_device* pDevice, const void* pPCMFrames, ma_uint32 frameCount, ma_uint32* pFramesWritten)
{
    ma_uint32 totalFramesWritten;

    MA_ASSERT(pDevice != NULL);
    MA_ASSERT(pPCMFrames != NULL);
    MA_ASSERT(frameCount > 0);

    if (pFramesWritten != NULL) {
        *pFramesWritten = 0;
    }

    totalFramesWritten = 0;
    while (totalFramesWritten < frameCount) {
        if (ma_device__get_state(pDevice) != MA_STATE_STARTED) {
            return MA_DEVICE_NOT_STARTED;
        }

        /* Place the data into the mapped buffer if we have one. */
        if (pDevice->pulse.pMappedBufferPlayback != NULL && pDevice->pulse.mappedBufferFramesRemainingPlayback > 0) {
            ma_uint32 bpf = ma_get_bytes_per_frame(pDevice->playback.internalFormat, pDevice->playback.internalChannels);
            ma_uint32 mappedBufferFramesConsumed = pDevice->pulse.mappedBufferFramesCapacityPlayback - pDevice->pulse.mappedBufferFramesRemainingPlayback;

            void* pDst = (ma_uint8*)pDevice->pulse.pMappedBufferPlayback + (mappedBufferFramesConsumed * bpf);
            const void* pSrc = (const ma_uint8*)pPCMFrames + (totalFramesWritten * bpf);
            ma_uint32  framesToCopy = ma_min(pDevice->pulse.mappedBufferFramesRemainingPlayback, (frameCount - totalFramesWritten));
            MA_COPY_MEMORY(pDst, pSrc, framesToCopy * bpf);

            pDevice->pulse.mappedBufferFramesRemainingPlayback -= framesToCopy;
            totalFramesWritten += framesToCopy;
        }

        /*
        Getting here means we've run out of data in the currently mapped chunk. We need to write this to the device and then try
        mapping another chunk. If this fails we need to wait for space to become available.
        */
        if (pDevice->pulse.mappedBufferFramesCapacityPlayback > 0 && pDevice->pulse.mappedBufferFramesRemainingPlayback == 0) {
            size_t nbytes = pDevice->pulse.mappedBufferFramesCapacityPlayback * ma_get_bytes_per_frame(pDevice->playback.internalFormat, pDevice->playback.internalChannels);

            int error = ((ma_pa_stream_write_proc)pDevice->pContext->pulse.pa_stream_write)((ma_pa_stream*)pDevice->pulse.pStreamPlayback, pDevice->pulse.pMappedBufferPlayback, nbytes, NULL, 0, MA_PA_SEEK_RELATIVE);
            if (error < 0) {
                return ma_post_error(pDevice, MA_LOG_LEVEL_ERROR, "[PulseAudio] Failed to write data to the PulseAudio stream.", ma_result_from_pulse(error));
            }

            pDevice->pulse.pMappedBufferPlayback = NULL;
            pDevice->pulse.mappedBufferFramesRemainingPlayback = 0;
            pDevice->pulse.mappedBufferFramesCapacityPlayback = 0;
        }

        MA_ASSERT(totalFramesWritten <= frameCount);
        if (totalFramesWritten == frameCount) {
            break;
        }

        /* Getting here means we need to map a new buffer. If we don't have enough space we need to wait for more. */
        for (;;) {
            size_t writableSizeInBytes;

            /* If the device has been corked, don't try to continue. */
            if (((ma_pa_stream_is_corked_proc)pDevice->pContext->pulse.pa_stream_is_corked)((ma_pa_stream*)pDevice->pulse.pStreamPlayback)) {
                break;
            }

            writableSizeInBytes = ((ma_pa_stream_writable_size_proc)pDevice->pContext->pulse.pa_stream_writable_size)((ma_pa_stream*)pDevice->pulse.pStreamPlayback);
            if (writableSizeInBytes != (size_t)-1) {
                if (writableSizeInBytes > 0) {
                    /* Data is avaialable. */
                    size_t bytesToMap = writableSizeInBytes;
                    int error = ((ma_pa_stream_begin_write_proc)pDevice->pContext->pulse.pa_stream_begin_write)((ma_pa_stream*)pDevice->pulse.pStreamPlayback, &pDevice->pulse.pMappedBufferPlayback, &bytesToMap);
                    if (error < 0) {
                        return ma_post_error(pDevice, MA_LOG_LEVEL_ERROR, "[PulseAudio] Failed to map write buffer.", ma_result_from_pulse(error));
                    }

                    pDevice->pulse.mappedBufferFramesCapacityPlayback  = bytesToMap / ma_get_bytes_per_frame(pDevice->playback.internalFormat, pDevice->playback.internalChannels);
                    pDevice->pulse.mappedBufferFramesRemainingPlayback = pDevice->pulse.mappedBufferFramesCapacityPlayback;

                    break;
                } else {
                    /* No data available. Need to wait for more. */
                    int error = ((ma_pa_mainloop_iterate_proc)pDevice->pContext->pulse.pa_mainloop_iterate)((ma_pa_mainloop*)pDevice->pulse.pMainLoop, 1, NULL);
                    if (error < 0) {
                        return ma_result_from_pulse(error);
                    }

                    continue;
                }
            } else {
                return ma_post_error(pDevice, MA_LOG_LEVEL_ERROR, "[PulseAudio] Failed to query the stream's writable size.", MA_ERROR);
            }
        }
    }

    if (pFramesWritten != NULL) {
        *pFramesWritten = totalFramesWritten;
    }

    return MA_SUCCESS;
}